

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

void duckdb::RegularLikeFunction<duckdb::NotLikeOperator,true>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  idx_t count;
  data_ptr_t pdVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  sel_t *idx;
  bool bVar5;
  BoundFunctionExpression *pBVar6;
  pointer pFVar7;
  reference pvVar8;
  reference pvVar9;
  idx_t iVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *other;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  idx_t i_1;
  ulong uVar12;
  ulong uVar13;
  element_type *peVar14;
  ulong uVar15;
  void *in_R8;
  element_type *peVar16;
  data_ptr_t pdVar17;
  ulong uVar18;
  idx_t i;
  ulong uVar19;
  idx_t iVar20;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  ValidityMask local_a0;
  ulong local_80;
  UnifiedVectorFormat local_78;
  
  pBVar6 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  if ((pBVar6->bind_info).
      super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl == (FunctionData *)0x0) {
    pvVar8 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    pvVar9 = vector<duckdb::Vector,_true>::get<true>(&input->data,1);
    BinaryExecutor::ExecuteStandard<duckdb::string_t,duckdb::string_t,bool,duckdb::NotLikeOperator>
              (pvVar8,pvVar9,result,input->count);
    return;
  }
  pFVar7 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar6->bind_info);
  pvVar8 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
  count = input->count;
  local_a0.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)pFVar7;
  if (pvVar8->vector_type == FLAT_VECTOR) {
    pvVar9 = pvVar8;
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    pdVar17 = pvVar8->data;
    FlatVector::VerifyFlatVector(pvVar8);
    FlatVector::VerifyFlatVector(result);
    if ((pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      pdVar17 = pdVar17 + 8;
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        input_03.value.pointer.ptr = (char *)*(undefined8 *)pdVar17;
        input_03.value._0_8_ = *(undefined8 *)(pdVar17 + -8);
        bVar5 = UnaryLambdaWrapper::
                Operation<duckdb::RegularLikeFunction<duckdb::NotLikeOperator,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                          (input_03,&local_a0,(idx_t)pvVar9,in_R8);
        pdVar1[iVar20] = bVar5;
        pdVar17 = pdVar17 + 0x10;
      }
    }
    else {
      other = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pvVar8->validity;
      TemplatedValidityMask<unsigned_long>::Initialize
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 (TemplatedValidityMask<unsigned_long> *)other);
      local_80 = count + 0x3f >> 6;
      peVar16 = (element_type *)(pdVar17 + 8);
      uVar19 = 0;
      local_a0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar16;
      local_a0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = other;
      for (uVar15 = 0; uVar15 != local_80; uVar15 = uVar15 + 1) {
        puVar3 = ((TemplatedValidityMask<unsigned_long> *)&other->_vptr__Sp_counted_base)->
                 validity_mask;
        if (puVar3 == (unsigned_long *)0x0) {
          uVar12 = uVar19 + 0x40;
          if (count <= uVar19 + 0x40) {
            uVar12 = count;
          }
LAB_0152d57c:
          peVar14 = peVar16 + uVar19 * 2;
          for (; _Var11._M_pi = local_a0.super_TemplatedValidityMask<unsigned_long>.validity_data.
                                internal.
                                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi, uVar13 = uVar19, uVar19 < uVar12;
              uVar19 = uVar19 + 1) {
            input_00.value.pointer.ptr =
                 (char *)(peVar14->owned_data).
                         super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                         _M_t.
                         super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                         .super__Head_base<0UL,_unsigned_long_*,_false>;
            input_00.value._0_8_ =
                 (unsigned_long *)
                 peVar14[-1].owned_data.
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            bVar5 = UnaryLambdaWrapper::
                    Operation<duckdb::RegularLikeFunction<duckdb::NotLikeOperator,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                              (input_00,&local_a0,(idx_t)other,in_R8);
            pdVar1[uVar19] = bVar5;
            peVar14 = peVar14 + 2;
          }
        }
        else {
          uVar4 = puVar3[uVar15];
          uVar12 = uVar19 + 0x40;
          if (count <= uVar19 + 0x40) {
            uVar12 = count;
          }
          peVar16 = local_a0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          if (uVar4 == 0xffffffffffffffff) goto LAB_0152d57c;
          _Var11._M_pi = other;
          uVar13 = uVar12;
          if (uVar4 != 0) {
            peVar14 = local_a0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + uVar19 * 2;
            uVar18 = 0;
            local_a0.super_TemplatedValidityMask<unsigned_long>.capacity = uVar15;
            for (; _Var11._M_pi = local_a0.super_TemplatedValidityMask<unsigned_long>.validity_data.
                                  internal.
                                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi, uVar13 = uVar19,
                uVar15 = local_a0.super_TemplatedValidityMask<unsigned_long>.capacity,
                peVar16 = local_a0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                          .
                          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr, uVar19 < uVar12; uVar19 = uVar19 + 1) {
              if ((uVar4 >> (uVar18 & 0x3f) & 1) != 0) {
                input_01.value.pointer.ptr =
                     (char *)(peVar14->owned_data).
                             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
                             ._M_t.
                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                             .super__Head_base<0UL,_unsigned_long_*,_false>;
                input_01.value._0_8_ =
                     (unsigned_long *)
                     peVar14[-1].owned_data.
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
                bVar5 = UnaryLambdaWrapper::
                        Operation<duckdb::RegularLikeFunction<duckdb::NotLikeOperator,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                                  (input_01,&local_a0,(idx_t)other,in_R8);
                pdVar1[uVar19] = bVar5;
              }
              peVar14 = peVar14 + 2;
              uVar18 = uVar18 + 1;
            }
          }
        }
        other = _Var11._M_pi;
        uVar19 = uVar13;
      }
    }
  }
  else if (pvVar8->vector_type == CONSTANT_VECTOR) {
    pvVar9 = pvVar8;
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar1 = result->data;
    paVar2 = (anon_union_16_2_67f50693_for_value *)pvVar8->data;
    puVar3 = (pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar3 != (unsigned_long *)0x0) && ((*puVar3 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    bVar5 = UnaryLambdaWrapper::
            Operation<duckdb::RegularLikeFunction<duckdb::NotLikeOperator,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                      ((string_t)paVar2->pointer,&local_a0,(idx_t)pvVar9,in_R8);
    *pdVar1 = bVar5;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(pvVar8,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        idx = (local_78.sel)->sel_vector;
        iVar10 = iVar20;
        if (idx != (sel_t *)0x0) {
          iVar10 = (idx_t)idx[iVar20];
        }
        input_04.value.pointer.ptr = (char *)*(undefined8 *)(local_78.data + iVar10 * 0x10 + 8);
        input_04.value._0_8_ = *(undefined8 *)(local_78.data + iVar10 * 0x10);
        bVar5 = UnaryLambdaWrapper::
                Operation<duckdb::RegularLikeFunction<duckdb::NotLikeOperator,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                          (input_04,&local_a0,(idx_t)idx,in_R8);
        pdVar1[iVar20] = bVar5;
      }
    }
    else {
      for (iVar20 = 0; count != iVar20; iVar20 = iVar20 + 1) {
        iVar10 = iVar20;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          iVar10 = (idx_t)(local_78.sel)->sel_vector[iVar20];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar10 >> 6]
             >> (iVar10 & 0x3f) & 1) == 0) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar20);
        }
        else {
          input_02.value.pointer.ptr = (char *)*(undefined8 *)(local_78.data + iVar10 * 0x10 + 8);
          input_02.value._0_8_ = *(undefined8 *)(local_78.data + iVar10 * 0x10);
          bVar5 = UnaryLambdaWrapper::
                  Operation<duckdb::RegularLikeFunction<duckdb::NotLikeOperator,true>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                            (input_02,&local_a0,
                             local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_mask[iVar10 >> 6],in_R8);
          pdVar1[iVar20] = bVar5;
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return;
}

Assistant:

static void RegularLikeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	if (func_expr.bind_info) {
		auto &matcher = func_expr.bind_info->Cast<LikeMatcher>();
		// use fast like matcher
		UnaryExecutor::Execute<string_t, bool>(input.data[0], result, input.size(), [&](string_t input) {
			return INVERT ? !matcher.Match(input) : matcher.Match(input);
		});
	} else {
		// use generic like matcher
		BinaryExecutor::ExecuteStandard<string_t, string_t, bool, OP>(input.data[0], input.data[1], result,
		                                                              input.size());
	}
}